

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

void __thiscall cmake::cmake(cmake *this,Role role,Mode mode,ProjectKind projectKind)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pbVar3;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *pvVar4;
  cmFileTimeCache *this_00;
  cmVariableWatch *this_01;
  cmState *this_02;
  cmMessenger *pcVar5;
  undefined4 in_register_00000034;
  pointer *__ptr_2;
  pointer *__ptr;
  pointer pbVar6;
  long lVar7;
  __node_gen_type __node_gen;
  __hashtable *__h_5;
  __hashtable *__h_4;
  __hashtable *__h_3;
  __hashtable *__h_2;
  __hashtable *__h_1;
  __hashtable *__h;
  cmStateSnapshot local_118;
  unique_ptr<cmState,_std::default_delete<cmState>_> *local_100;
  cmState *local_f8;
  cmState *local_f0;
  cmState *local_e8;
  cmState *local_e0;
  cmState *local_d8;
  cmState *local_d0;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_c8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_c0;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_b8;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_b0;
  cmGeneratedFileStream *local_a8;
  undefined8 local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_a0 = CONCAT44(in_register_00000034,role);
  p_Var1 = &(this->DiagLevels)._M_t._M_impl.super__Rb_tree_header;
  (this->DiagLevels)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->DiagLevels)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Generators).
  super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Generators).
  super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Generators).
  super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ExtraGenerators).
  super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ExtraGenerators).
  super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ExtraGenerators).
  super__Vector_base<cmExternalMakefileProjectGeneratorFactory_*,_std::allocator<cmExternalMakefileProjectGeneratorFactory_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->DiagLevels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->DiagLevels)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->DiagLevels)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_88 = &(this->GeneratorInstance).field_2;
  (this->GeneratorInstance)._M_dataplus._M_p = (pointer)local_88;
  (this->GeneratorInstance)._M_string_length = 0;
  (this->GeneratorInstance).field_2._M_local_buf[0] = '\0';
  local_90 = &(this->GeneratorPlatform).field_2;
  (this->GeneratorPlatform)._M_dataplus._M_p = (pointer)local_90;
  (this->GeneratorPlatform)._M_string_length = 0;
  (this->GeneratorPlatform).field_2._M_local_buf[0] = '\0';
  local_98 = &(this->GeneratorToolset).field_2;
  (this->GeneratorToolset)._M_dataplus._M_p = (pointer)local_98;
  (this->GeneratorToolset)._M_string_length = 0;
  (this->GeneratorToolset).field_2._M_local_buf[0] = '\0';
  this->GeneratorInstanceSet = false;
  this->GeneratorPlatformSet = false;
  this->GeneratorToolsetSet = false;
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  (this->ProgressCallback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->ProgressCallback)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->ProgressCallback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->ProgressCallback).super__Function_base._M_functor + 8) = 0;
  this->CurrentWorkingMode = NORMAL_MODE;
  this->DebugOutput = false;
  this->DebugFindOutput = false;
  this->Trace = false;
  this->TraceExpand = false;
  this->TraceFormatVar = TRACE_HUMAN;
  local_a8 = &this->TraceFile;
  cmGeneratedFileStream::cmGeneratedFileStream(local_a8,None);
  this->TraceRedirect = (cmake *)0x0;
  this->WarnUninitialized = false;
  this->WarnUnusedCli = true;
  this->CheckSystemVars = false;
  this->IgnoreWarningAsError = false;
  p_Var1 = &(this->UsedCliVariables)._M_t._M_impl.super__Rb_tree_header;
  (this->UsedCliVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->UsedCliVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->UsedCliVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->UsedCliVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->UsedCliVariables)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  paVar2 = &(this->CMakeEditCommand).field_2;
  (this->CMakeEditCommand)._M_dataplus._M_p = (pointer)paVar2;
  (this->CMakeEditCommand)._M_string_length = 0;
  (this->CMakeEditCommand).field_2._M_local_buf[0] = '\0';
  local_38 = &(this->CXXEnvironment).field_2;
  (this->CXXEnvironment)._M_dataplus._M_p = (pointer)local_38;
  (this->CXXEnvironment)._M_string_length = 0;
  (this->CXXEnvironment).field_2._M_local_buf[0] = '\0';
  local_40 = &(this->CCEnvironment).field_2;
  (this->CCEnvironment)._M_dataplus._M_p = (pointer)local_40;
  (this->CCEnvironment)._M_string_length = 0;
  (this->CCEnvironment).field_2._M_local_buf[0] = '\0';
  local_48 = &(this->CheckBuildSystemArgument).field_2;
  (this->CheckBuildSystemArgument)._M_dataplus._M_p = (pointer)local_48;
  (this->CheckBuildSystemArgument)._M_string_length = 0;
  (this->CheckBuildSystemArgument).field_2._M_local_buf[0] = '\0';
  local_50 = &(this->CheckStampFile).field_2;
  (this->CheckStampFile)._M_dataplus._M_p = (pointer)local_50;
  (this->CheckStampFile)._M_string_length = 0;
  (this->CheckStampFile).field_2._M_local_buf[0] = '\0';
  local_58 = &(this->CheckStampList).field_2;
  (this->CheckStampList)._M_dataplus._M_p = (pointer)local_58;
  (this->CheckStampList)._M_string_length = 0;
  (this->CheckStampList).field_2._M_local_buf[0] = '\0';
  local_60 = &(this->VSSolutionFile).field_2;
  (this->VSSolutionFile)._M_dataplus._M_p = (pointer)local_60;
  (this->VSSolutionFile)._M_string_length = 0;
  (this->VSSolutionFile).field_2._M_local_buf[0] = '\0';
  local_68 = &(this->EnvironmentGenerator).field_2;
  (this->EnvironmentGenerator)._M_dataplus._M_p = (pointer)local_68;
  (this->EnvironmentGenerator)._M_string_length = 0;
  (this->EnvironmentGenerator).field_2._M_local_buf[0] = '\0';
  local_c8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->CLikeSourceFileExtensions;
  (this->CLikeSourceFileExtensions).ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->CLikeSourceFileExtensions).ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CLikeSourceFileExtensions).ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0 = (cmState *)&(this->CLikeSourceFileExtensions).unordered;
  (this->CLikeSourceFileExtensions).unordered._M_h._M_buckets =
       &(this->CLikeSourceFileExtensions).unordered._M_h._M_single_bucket;
  (this->CLikeSourceFileExtensions).unordered._M_h._M_bucket_count = 1;
  (this->CLikeSourceFileExtensions).unordered._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->CLikeSourceFileExtensions).unordered._M_h._M_element_count = 0;
  (this->CLikeSourceFileExtensions).unordered._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->CLikeSourceFileExtensions).unordered._M_h._M_rehash_policy._M_next_resize = 0;
  (this->CLikeSourceFileExtensions).unordered._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->HeaderFileExtensions).ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->HeaderFileExtensions).ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->HeaderFileExtensions).ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->HeaderFileExtensions).unordered._M_h._M_buckets =
       &(this->HeaderFileExtensions).unordered._M_h._M_single_bucket;
  (this->HeaderFileExtensions).unordered._M_h._M_bucket_count = 1;
  (this->HeaderFileExtensions).unordered._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->HeaderFileExtensions).unordered._M_h._M_element_count = 0;
  (this->HeaderFileExtensions).unordered._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->HeaderFileExtensions).unordered._M_h._M_rehash_policy._M_next_resize = 0;
  (this->HeaderFileExtensions).unordered._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->CudaFileExtensions).ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->CudaFileExtensions).ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CudaFileExtensions).ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->CudaFileExtensions).unordered._M_h._M_buckets =
       &(this->CudaFileExtensions).unordered._M_h._M_single_bucket;
  (this->CudaFileExtensions).unordered._M_h._M_bucket_count = 1;
  (this->CudaFileExtensions).unordered._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->CudaFileExtensions).unordered._M_h._M_element_count = 0;
  (this->CudaFileExtensions).unordered._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->ISPCFileExtensions).ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ISPCFileExtensions).ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ISPCFileExtensions).ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->CudaFileExtensions).unordered._M_h._M_rehash_policy._M_next_resize = 0;
  (this->CudaFileExtensions).unordered._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->ISPCFileExtensions).unordered._M_h._M_buckets =
       &(this->ISPCFileExtensions).unordered._M_h._M_single_bucket;
  (this->ISPCFileExtensions).unordered._M_h._M_bucket_count = 1;
  (this->ISPCFileExtensions).unordered._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->ISPCFileExtensions).unordered._M_h._M_element_count = 0;
  (this->ISPCFileExtensions).unordered._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->FortranFileExtensions).ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->FortranFileExtensions).ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->FortranFileExtensions).ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ISPCFileExtensions).unordered._M_h._M_rehash_policy._M_next_resize = 0;
  (this->ISPCFileExtensions).unordered._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->FortranFileExtensions).unordered._M_h._M_buckets =
       &(this->FortranFileExtensions).unordered._M_h._M_single_bucket;
  (this->FortranFileExtensions).unordered._M_h._M_bucket_count = 1;
  (this->FortranFileExtensions).unordered._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->FortranFileExtensions).unordered._M_h._M_element_count = 0;
  (this->FortranFileExtensions).unordered._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->HipFileExtensions).ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->HipFileExtensions).ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->HipFileExtensions).ordered.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->FortranFileExtensions).unordered._M_h._M_rehash_policy._M_next_resize = 0;
  (this->FortranFileExtensions).unordered._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->HipFileExtensions).unordered._M_h._M_buckets =
       &(this->HipFileExtensions).unordered._M_h._M_single_bucket;
  local_d8 = (cmState *)&(this->HeaderFileExtensions).unordered;
  (this->HipFileExtensions).unordered._M_h._M_bucket_count = 1;
  local_b0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->CudaFileExtensions;
  (this->HipFileExtensions).unordered._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->HipFileExtensions).unordered._M_h._M_element_count = 0;
  (this->HipFileExtensions).unordered._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_e0 = (cmState *)&(this->CudaFileExtensions).unordered;
  this->ClearBuildSystem = false;
  this->DebugTryCompile = false;
  this->FreshCache = false;
  this->RegenerateDuringBuild = false;
  local_c0 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->ISPCFileExtensions;
  (this->HipFileExtensions).unordered._M_h._M_rehash_policy._M_next_resize = 0;
  (this->HipFileExtensions).unordered._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_f8 = (cmState *)&(this->ISPCFileExtensions).unordered;
  local_e8 = (cmState *)&(this->FortranFileExtensions).unordered;
  local_b8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->HipFileExtensions;
  local_f0 = (cmState *)&(this->HipFileExtensions).unordered;
  this_00 = (cmFileTimeCache *)operator_new(0x38);
  cmFileTimeCache::cmFileTimeCache(this_00);
  (this->FileTimeCache)._M_t.
  super___uniq_ptr_impl<cmFileTimeCache,_std::default_delete<cmFileTimeCache>_>._M_t.
  super__Tuple_impl<0UL,_cmFileTimeCache_*,_std::default_delete<cmFileTimeCache>_>.
  super__Head_base<0UL,_cmFileTimeCache_*,_false>._M_head_impl = this_00;
  local_78 = &(this->GraphVizFile).field_2;
  (this->GraphVizFile)._M_dataplus._M_p = (pointer)local_78;
  (this->GraphVizFile)._M_string_length = 0;
  (this->GraphVizFile).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->InstalledFiles)._M_t._M_impl.super__Rb_tree_header;
  (this->InstalledFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->InstalledFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->InstalledFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->InstalledFiles)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->InstalledFiles)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->UnprocessedPresetVariables)._M_t._M_impl.super__Rb_tree_header;
  (this->UnprocessedPresetVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->UnprocessedPresetVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->UnprocessedPresetVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->UnprocessedPresetVariables)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->UnprocessedPresetVariables)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->UnprocessedPresetEnvironment)._M_t._M_impl.super__Rb_tree_header;
  (this->UnprocessedPresetEnvironment)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->UnprocessedPresetEnvironment)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->UnprocessedPresetEnvironment)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->UnprocessedPresetEnvironment)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->UnprocessedPresetEnvironment)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_70 = paVar2;
  this_01 = (cmVariableWatch *)operator_new(0x30);
  cmVariableWatch::cmVariableWatch(this_01);
  (this->VariableWatch)._M_t.
  super___uniq_ptr_impl<cmVariableWatch,_std::default_delete<cmVariableWatch>_>._M_t.
  super__Tuple_impl<0UL,_cmVariableWatch_*,_std::default_delete<cmVariableWatch>_>.
  super__Head_base<0UL,_cmVariableWatch_*,_false>._M_head_impl = this_01;
  (this->FileAPI)._M_t.super___uniq_ptr_impl<cmFileAPI,_std::default_delete<cmFileAPI>_>._M_t.
  super__Tuple_impl<0UL,_cmFileAPI_*,_std::default_delete<cmFileAPI>_>.
  super__Head_base<0UL,_cmFileAPI_*,_false>._M_head_impl = (cmFileAPI *)0x0;
  this_02 = (cmState *)operator_new(0x2c8);
  cmState::cmState(this_02,mode,projectKind);
  local_100 = &this->State;
  (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
  super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
  super__Head_base<0UL,_cmState_*,_false>._M_head_impl = this_02;
  cmStateSnapshot::cmStateSnapshot(&this->CurrentSnapshot,(cmState *)0x0);
  pcVar5 = (cmMessenger *)operator_new(0x30);
  *(undefined8 *)
   ((long)&(pcVar5->TopSource).
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
   + 0x20) = 0;
  pcVar5->SuppressDevWarnings = false;
  pcVar5->SuppressDeprecatedWarnings = false;
  pcVar5->DevWarningsAsErrors = false;
  pcVar5->DeprecatedWarningsAsErrors = false;
  *(undefined4 *)&pcVar5->field_0x2c = 0;
  *(undefined8 *)
   ((long)&(pcVar5->TopSource).
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
   + 0x10) = 0;
  *(undefined8 *)
   ((long)&(pcVar5->TopSource).
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
   + 0x18) = 0;
  *(undefined8 *)
   &(pcVar5->TopSource).
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
       = 0;
  *(undefined8 *)
   ((long)&(pcVar5->TopSource).
           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
   + 8) = 0;
  (this->Messenger)._M_t.super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
  super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
  super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl = pcVar5;
  (this->TraceOnlyThisSources).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->TraceOnlyThisSources).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->TraceOnlyThisSources).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->DebugFindPkgs)._M_t._M_impl.super__Rb_tree_header;
  (this->DebugFindPkgs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->DebugFindPkgs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->DebugFindPkgs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->DebugFindPkgs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->DebugFindPkgs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->DebugFindVars)._M_t._M_impl.super__Rb_tree_header;
  (this->DebugFindVars)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->DebugFindVars)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->DebugFindVars)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->DebugFindVars)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->DebugFindVars)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->MessageLogLevel = LOG_STATUS;
  this->LogLevelWasSetViaCLI = false;
  this->LogContext = false;
  local_80 = &this->CheckInProgressMessages;
  (this->CheckInProgressMessages).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->CheckInProgressMessages).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->CheckInProgressMessages).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->CheckInProgressMessages).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->CheckInProgressMessages).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->CheckInProgressMessages).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->CheckInProgressMessages).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->CheckInProgressMessages).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->CheckInProgressMessages).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->CheckInProgressMessages).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map((_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_80,0);
  (this->GlobalGenerator)._M_t.
  super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>._M_t.
  super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>.
  super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl = (cmGlobalGenerator *)0x0;
  (this->ProfilingOutput)._M_t.
  super___uniq_ptr_impl<cmMakefileProfilingData,_std::default_delete<cmMakefileProfilingData>_>._M_t
  .super__Tuple_impl<0UL,_cmMakefileProfilingData_*,_std::default_delete<cmMakefileProfilingData>_>.
  super__Head_base<0UL,_cmMakefileProfilingData_*,_false>._M_head_impl =
       (cmMakefileProfilingData *)0x0;
  std::ofstream::close();
  cmState::CreateBaseSnapshot
            (&local_118,
             (local_100->_M_t).super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  (this->CurrentSnapshot).Position.Position = local_118.Position.Position;
  (this->CurrentSnapshot).State = local_118.State;
  (this->CurrentSnapshot).Position.Tree = local_118.Position.Tree;
  AddDefaultGenerators(this);
  AddDefaultExtraGenerators(this);
  if ((int)local_a0 - 1U < 2) {
    GetScriptingCommands
              ((local_100->_M_t).super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
               super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
               super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  }
  if ((int)local_a0 == 2) {
    GetProjectCommands((local_100->_M_t).
                       super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                       super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                       super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  }
  if ((mode == Help) || (mode == Project)) {
    LoadEnvironmentPresets(this);
  }
  cmSystemTools::EnableVSConsoleOutput();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_c8,0xd);
  lVar7 = 0;
  do {
    local_118.State = *(cmState **)(&DAT_009622d8 + lVar7);
    local_118.Position.Tree =
         *(cmLinkedTree<cmStateDetail::SnapshotDataType> **)(&UNK_009622e0 + lVar7);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
              (local_c8,(basic_string_view<char,_std::char_traits<char>_> *)&local_118);
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0xd0);
  pbVar6 = (this->CLikeSourceFileExtensions).ordered.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (this->CLikeSourceFileExtensions).ordered.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_118.State = local_d0;
  if (pbVar6 != pbVar3) {
    do {
      std::
      _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::__cxx11::string&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::basic_string_view<char,std::char_traits<char>>,true>>>>
                ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)local_d0,pbVar6,&local_118);
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != pbVar3);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&(this->HeaderFileExtensions).ordered,8);
  lVar7 = 0;
  do {
    local_118.State = *(cmState **)(&DAT_009623a8 + lVar7);
    local_118.Position.Tree =
         *(cmLinkedTree<cmStateDetail::SnapshotDataType> **)(&UNK_009623b0 + lVar7);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->HeaderFileExtensions,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_118);
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x80);
  pbVar6 = (this->HeaderFileExtensions).ordered.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (this->HeaderFileExtensions).ordered.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_118.State = local_d8;
  if (pbVar6 != pbVar3) {
    do {
      std::
      _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::__cxx11::string&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::basic_string_view<char,std::char_traits<char>>,true>>>>
                ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)local_d8,pbVar6,&local_118);
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != pbVar3);
  }
  pvVar4 = local_b0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_b0,1);
  local_118.State = (cmState *)&DAT_00000002;
  local_118.Position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x7781e4;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
            (pvVar4,(basic_string_view<char,_std::char_traits<char>_> *)&local_118);
  pbVar6 = (this->CudaFileExtensions).ordered.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (this->CudaFileExtensions).ordered.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_118.State = local_e0;
  if (pbVar6 != pbVar3) {
    do {
      std::
      _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::__cxx11::string&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::basic_string_view<char,std::char_traits<char>>,true>>>>
                ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)local_e0,pbVar6,&local_118);
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != pbVar3);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&(this->FortranFileExtensions).ordered,7);
  lVar7 = 0;
  do {
    local_118.State = *(cmState **)(&DAT_00962428 + lVar7);
    local_118.Position.Tree =
         *(cmLinkedTree<cmStateDetail::SnapshotDataType> **)(&UNK_00962430 + lVar7);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &this->FortranFileExtensions,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_118);
    lVar7 = lVar7 + 0x10;
  } while (lVar7 != 0x70);
  pbVar6 = (this->FortranFileExtensions).ordered.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (this->FortranFileExtensions).ordered.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_118.State = local_e8;
  if (pbVar6 != pbVar3) {
    do {
      std::
      _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::__cxx11::string&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::basic_string_view<char,std::char_traits<char>>,true>>>>
                ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)local_e8,pbVar6,&local_118);
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != pbVar3);
  }
  pvVar4 = local_b8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_b8,1);
  local_118.State = (cmState *)0x3;
  local_118.Position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x77820c;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
            (pvVar4,(basic_string_view<char,_std::char_traits<char>_> *)&local_118);
  pbVar6 = (this->HipFileExtensions).ordered.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (this->HipFileExtensions).ordered.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_118.State = local_f0;
  if (pbVar6 != pbVar3) {
    do {
      std::
      _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::__cxx11::string&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::basic_string_view<char,std::char_traits<char>>,true>>>>
                ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)local_f0,pbVar6,&local_118);
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != pbVar3);
  }
  pvVar4 = local_c0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_c0,1);
  local_118.State = (cmState *)0x4;
  local_118.Position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)0x778210;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
            (pvVar4,(basic_string_view<char,_std::char_traits<char>_> *)&local_118);
  pbVar6 = (this->ISPCFileExtensions).ordered.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (this->ISPCFileExtensions).ordered.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_118.State = local_f8;
  if (pbVar6 != pbVar3) {
    do {
      std::
      _Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::__cxx11::string&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::basic_string_view<char,std::char_traits<char>>,true>>>>
                ((_Hashtable<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Identity,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)local_f8,pbVar6,&local_118);
      pbVar6 = pbVar6 + 1;
    } while (pbVar6 != pbVar3);
  }
  return;
}

Assistant:

cmake::cmake(Role role, cmState::Mode mode, cmState::ProjectKind projectKind)
  : CMakeWorkingDirectory(cmSystemTools::GetCurrentWorkingDirectory())
  , FileTimeCache(cm::make_unique<cmFileTimeCache>())
#ifndef CMAKE_BOOTSTRAP
  , VariableWatch(cm::make_unique<cmVariableWatch>())
#endif
  , State(cm::make_unique<cmState>(mode, projectKind))
  , Messenger(cm::make_unique<cmMessenger>())
{
  this->TraceFile.close();
  this->CurrentSnapshot = this->State->CreateBaseSnapshot();

#ifdef __APPLE__
  struct rlimit rlp;
  if (!getrlimit(RLIMIT_STACK, &rlp)) {
    if (rlp.rlim_cur != rlp.rlim_max) {
      rlp.rlim_cur = rlp.rlim_max;
      setrlimit(RLIMIT_STACK, &rlp);
    }
  }
#endif

  this->AddDefaultGenerators();
  this->AddDefaultExtraGenerators();
  if (role == RoleScript || role == RoleProject) {
    this->AddScriptingCommands();
  }
  if (role == RoleProject) {
    this->AddProjectCommands();
  }

  if (mode == cmState::Project || mode == cmState::Help) {
    this->LoadEnvironmentPresets();
  }

  // Make sure we can capture the build tool output.
  cmSystemTools::EnableVSConsoleOutput();

  // Set up a list of source and header extensions.
  // These are used to find files when the extension is not given.
  {
    auto setupExts = [](FileExtensions& exts,
                        std::initializer_list<cm::string_view> extList) {
      // Fill ordered vector
      exts.ordered.reserve(extList.size());
      for (cm::string_view ext : extList) {
        exts.ordered.emplace_back(ext);
      }
      // Fill unordered set
      exts.unordered.insert(exts.ordered.begin(), exts.ordered.end());
    };

    // The "c" extension MUST precede the "C" extension.
    setupExts(this->CLikeSourceFileExtensions,
              { "c", "C", "c++", "cc", "cpp", "cxx", "cu", "mpp", "m", "M",
                "mm", "ixx", "cppm" });
    setupExts(this->HeaderFileExtensions,
              { "h", "hh", "h++", "hm", "hpp", "hxx", "in", "txx" });
    setupExts(this->CudaFileExtensions, { "cu" });
    setupExts(this->FortranFileExtensions,
              { "f", "F", "for", "f77", "f90", "f95", "f03" });
    setupExts(this->HipFileExtensions, { "hip" });
    setupExts(this->ISPCFileExtensions, { "ispc" });
  }
}